

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

int __thiscall Catch::Session::runInternal(Session *this)

{
  const_iterator __position;
  TestCase **ppTVar1;
  pointer pTVar2;
  pointer pbVar3;
  undefined8 uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar8;
  undefined4 extraout_var;
  long *plVar9;
  long lVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  undefined4 extraout_var_00;
  ListeningReporter *pLVar12;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *testCases;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  _Base_ptr p_Var13;
  char *pcVar14;
  ostream *poVar15;
  FilterMatch *match_1;
  Reporters *this_00;
  element_type *peVar16;
  long lVar17;
  FilterMatch *match;
  element_type *peVar18;
  TestCase **__v;
  undefined8 *puVar19;
  TestCase *test;
  pointer pTVar20;
  pointer *__x;
  undefined1 auVar21 [12];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  Totals totals;
  TestGroup tests;
  _Head_base<0UL,_Catch::IStreamingReporter_*,_false> local_320;
  undefined1 local_318 [16];
  undefined1 local_308 [48];
  undefined1 local_2d8 [8];
  undefined1 local_2d0 [40];
  pointer local_2a8;
  pointer pbStack_2a0;
  ListeningReporter *local_298;
  pointer local_290;
  IConfigPtr local_288;
  undefined1 local_278 [240];
  long *local_188;
  ulong local_168;
  long *local_140;
  undefined1 local_78 [64];
  _Alloc_hider _Stack_38;
  
  if (this->m_startupExceptions != false) {
    return 1;
  }
  lVar17 = 0;
  if ((this->m_configData).showHelp != false) {
    return 0;
  }
  if ((this->m_configData).libIdentify != false) {
    return 0;
  }
  config(this);
  seedRng(&((this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super_IConfig);
  local_290 = (pointer)&this->m_config;
  if ((this->m_configData).filenamesAsTags == true) {
    peVar18 = (((shared_ptr<Catch::Config> *)local_290)->
              super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    pSVar8 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
             ::getInternal();
    iVar6 = (*(pSVar8->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[3])(pSVar8);
    plVar9 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar6) + 0x18))
                               ((long *)CONCAT44(extraout_var,iVar6),peVar18);
    lVar17 = plVar9[1];
    if (*plVar9 != lVar17) {
      __x = (pointer *)(*plVar9 + 0x60);
      do {
        clara::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_318,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)__x);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_278,
                   (char *)(((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)(__x + 6))->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start,(allocator<char> *)&local_288)
        ;
        lVar10 = std::__cxx11::string::find_last_of((char *)local_278,0x1ab61e,0xffffffffffffffff);
        if (lVar10 == -1) {
          std::__cxx11::string::replace((ulong)local_278,0,(char *)0x0,0x1a9a41);
        }
        else {
          std::__cxx11::string::erase((ulong)local_278,0);
          *(char *)local_278._0_8_ = '#';
        }
        p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  std::__cxx11::string::rfind
                            ((char)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_278,0x2e);
        if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xffffffffffffffff) {
          if ((ulong)local_278._8_8_ < p_Var11) {
            auVar21 = std::__throw_out_of_range_fmt
                                ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                                 "basic_string::erase",p_Var11);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_318._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_318._8_8_);
            }
            if (local_288.super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_288.
                         super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_);
            }
            if (auVar21._8_4_ == 1) {
              plVar9 = (long *)__cxa_begin_catch(auVar21._0_8_);
              pcVar14 = (char *)(**(code **)(*plVar9 + 0x10))(plVar9);
              poVar15 = std::operator<<((ostream *)&std::cerr,pcVar14);
              std::endl<char,std::char_traits<char>>(poVar15);
              __cxa_end_catch();
              return 0xff;
            }
            _Unwind_Resume(auVar21._0_8_);
          }
          *(char *)(local_278._0_8_ + (long)p_Var11) = '\0';
          local_278._8_8_ = p_Var11;
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_318,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278);
        clara::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_2d0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_318);
        setTags((TestCaseInfo *)(__x + -0xc),
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2d0);
        clara::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2d0);
        if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
          operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
        }
        clara::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_318);
        lVar10 = (long)(__x + 0xb);
        __x = __x + 0x17;
      } while (lVar10 != lVar17);
    }
  }
  list((Catch *)local_278,(shared_ptr<Catch::Config> *)local_290);
  iVar6 = (int)lVar17;
  if ((int *)local_278._0_8_ != (int *)0x0) {
    iVar6 = 0xff;
    if (*(int *)local_278._0_8_ < 0xff) {
      iVar6 = *(int *)local_278._0_8_;
    }
  }
  if ((int *)local_278._0_8_ != (int *)0x0) {
    return iVar6;
  }
  local_278._0_8_ =
       (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_278._8_8_ =
       (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_)->_M_use_count + 1;
    }
  }
  local_288.super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &((this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_IConfig;
  local_288.super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_288.super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_288.super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_288.super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_288.super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_288.super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  pSVar8 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
           ::getInternal();
  iVar6 = (*(pSVar8->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar8);
  plVar9 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar6) + 0x20))
                             ((long *)CONCAT44(extraout_var_00,iVar6));
  if (*plVar9 == plVar9[1]) {
    local_318._0_8_ =
         (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_318._8_8_ =
         (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_318._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_318._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_318._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_318._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_318._8_8_)->_M_use_count + 1;
      }
    }
    anon_unknown_1::createReporter
              ((anon_unknown_1 *)&local_320,
               &(((element_type *)local_318._0_8_)->m_data).reporterName,(IConfigPtr *)local_318);
  }
  else {
    pLVar12 = (ListeningReporter *)operator_new(0x30);
    ListeningReporter::ListeningReporter(pLVar12);
    local_320._M_head_impl = (IStreamingReporter *)pLVar12;
    local_298 = pLVar12;
    pSVar8 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
             ::getInternal();
    iVar6 = (*(pSVar8->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar8);
    plVar9 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar6) + 0x20))
                               ((long *)CONCAT44(extraout_var_01,iVar6));
    puVar19 = (undefined8 *)*plVar9;
    local_308._40_8_ = plVar9[1];
    if (puVar19 != (undefined8 *)local_308._40_8_) {
      this_00 = &local_298->m_listeners;
      do {
        plVar9 = (long *)*puVar19;
        local_2d0._0_8_ =
             (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_2d0._8_8_ =
             (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        if ((element_type *)local_2d0._8_8_ != (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&((element_type *)local_2d0._8_8_)->m_data =
                 *(int *)&((element_type *)local_2d0._8_8_)->m_data + 1;
            UNLOCK();
          }
          else {
            *(int *)&((element_type *)local_2d0._8_8_)->m_data =
                 *(int *)&((element_type *)local_2d0._8_8_)->m_data + 1;
          }
        }
        ReporterConfig::ReporterConfig((ReporterConfig *)local_318,(IConfigPtr *)local_2d0);
        (**(code **)(*plVar9 + 0x10))
                  ((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                    *)local_2d8,plVar9,(ReporterConfig *)local_318);
        std::
        vector<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>,std::allocator<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>>
        ::
        emplace_back<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>
                  ((vector<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>,std::allocator<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>>
                    *)this_00,
                   (unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                    *)local_2d8);
        if ((_Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
             )local_2d8 != (IStreamingReporter *)0x0) {
          (*(*(_func_int ***)local_2d8)[1])();
        }
        local_2d8 = (undefined1  [8])0x0;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._0_8_);
        }
        if ((element_type *)local_2d0._8_8_ != (element_type *)0x0) {
          clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d0._8_8_);
        }
        puVar19 = puVar19 + 2;
      } while (puVar19 != (undefined8 *)local_308._40_8_);
    }
    pLVar12 = local_298;
    local_318._0_8_ =
         (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_318._8_8_ =
         (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_318._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_318._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_318._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_318._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_318._8_8_)->_M_use_count + 1;
      }
    }
    anon_unknown_1::createReporter
              ((anon_unknown_1 *)local_2d0,&(((element_type *)local_318._0_8_)->m_data).reporterName
               ,(IConfigPtr *)local_318);
    ListeningReporter::addReporter(pLVar12,(IStreamingReporterPtr *)local_2d0);
    if ((element_type *)local_2d0._0_8_ != (element_type *)0x0) {
      (*(*(_func_int ***)local_2d0._0_8_)[1])();
    }
    local_2d0._0_8_ =
         (__uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
          )0x0;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_318._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_318._8_8_);
  }
  RunContext::RunContext
            ((RunContext *)(local_278 + 0x10),&local_288,(IStreamingReporterPtr *)&local_320);
  if ((ListeningReporter *)local_320._M_head_impl != (ListeningReporter *)0x0) {
    (*((IStreamingReporter *)&(local_320._M_head_impl)->_vptr_IStreamingReporter)->
      _vptr_IStreamingReporter[1])();
  }
  if (local_288.super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_288.super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  uVar4 = local_278._0_8_;
  __position._M_node = (_Base_ptr)(local_78 + 8);
  local_78._8_4_ = 0;
  local_78._16_8_ = 0;
  local_78._40_8_ = 0;
  local_78._48_8_ = (pointer)0x0;
  local_78._56_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  _Stack_38._M_p = (pointer)0x0;
  local_78._24_8_ = __position._M_node;
  local_78._32_8_ = __position._M_node;
  pSVar8 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
           ::getInternal();
  iVar6 = (*(pSVar8->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[3])(pSVar8);
  testCases = (vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
              (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar6) + 0x18))
                        ((long *)CONCAT44(extraout_var_02,iVar6),uVar4);
  iVar6 = (**(code **)(*(long *)local_278._0_8_ + 0x68))();
  TestSpec::matchesByFilter
            ((Matches *)local_2d0,(TestSpec *)CONCAT44(extraout_var_03,iVar6),testCases,
             (IConfig *)local_278._0_8_);
  local_308._0_8_ = _Stack_38._M_p;
  local_318._8_8_ = local_78._56_8_;
  local_318._0_8_ = local_78._48_8_;
  local_78._48_8_ = local_2d0._0_8_;
  local_78._56_8_ = local_2d0._8_8_;
  _Stack_38._M_p = (pointer)local_2d0._16_8_;
  local_2d0._0_8_ =
       (__uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>)
       0x0;
  local_2d0._8_8_ = (pointer)0x0;
  local_2d0._16_8_ = (pointer)0x0;
  clara::std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
  ~vector((vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_> *)
          local_318);
  clara::std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
  ~vector((vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_> *)
          local_2d0);
  iVar6 = (**(code **)(*(long *)local_278._0_8_ + 0x68))();
  local_308._40_8_ = local_78._56_8_;
  if (local_78._48_8_ == local_78._56_8_) {
    if (*(long *)(CONCAT44(extraout_var_04,iVar6) + 0x18) ==
        *(long *)(CONCAT44(extraout_var_04,iVar6) + 0x20)) {
      pTVar20 = (testCases->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
                _M_impl.super__Vector_impl_data._M_start;
      pTVar2 = (testCases->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      if (pTVar20 != pTVar2) {
        do {
          if (((pTVar20->super_TestCaseInfo).properties & IsHidden) == None) {
            local_318._0_8_ = pTVar20;
            std::
            _Rb_tree<Catch::TestCase_const*,Catch::TestCase_const*,std::_Identity<Catch::TestCase_const*>,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>
            ::_M_emplace_unique<Catch::TestCase_const*>
                      ((_Rb_tree<Catch::TestCase_const*,Catch::TestCase_const*,std::_Identity<Catch::TestCase_const*>,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>
                        *)local_78,(TestCase **)local_318);
          }
          pTVar20 = pTVar20 + 1;
        } while (pTVar20 != pTVar2);
      }
      goto LAB_00170640;
    }
    if (local_78._48_8_ == local_78._56_8_) goto LAB_00170640;
  }
  peVar18 = (element_type *)local_78._48_8_;
  do {
    ppTVar1 = (TestCase **)(peVar18->m_data).benchmarkConfidenceInterval;
    local_318._0_8_ = (pointer)local_78;
    for (__v = *(TestCase ***)&(peVar18->m_data).benchmarkSamples; __v != ppTVar1; __v = __v + 1) {
      std::
      _Rb_tree<Catch::TestCase_const*,Catch::TestCase_const*,std::_Identity<Catch::TestCase_const*>,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>
      ::
      _M_insert_unique_<Catch::TestCase_const*const&,std::_Rb_tree<Catch::TestCase_const*,Catch::TestCase_const*,std::_Identity<Catch::TestCase_const*>,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>::_Alloc_node>
                ((_Rb_tree<Catch::TestCase_const*,Catch::TestCase_const*,std::_Identity<Catch::TestCase_const*>,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>
                  *)local_78,__position,__v,(_Alloc_node *)local_318);
    }
    peVar18 = (element_type *)&(peVar18->m_data).benchmarkWarmupTime;
  } while (peVar18 != (element_type *)local_308._40_8_);
LAB_00170640:
  iVar6 = (**(code **)(*(long *)local_278._0_8_ + 0x68))();
  local_2d0._0_8_ = local_2d0._0_8_ & 0xffffffff00000000;
  local_2d0._8_8_ = (pointer)0x0;
  local_2d0._16_8_ = (pointer)0x0;
  local_2d0._24_8_ = 0;
  local_2d0._32_8_ = 0;
  local_2a8 = (pointer)0x0;
  pbStack_2a0 = (pointer)0x0;
  (**(code **)(*(long *)local_278._0_8_ + 0x20))(local_318);
  RunContext::testGroupStarting((RunContext *)(local_278 + 0x10),(string *)local_318,1,1);
  if ((pointer)local_318._0_8_ != (pointer)local_308) {
    operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
  }
  peVar16 = (element_type *)local_78._48_8_;
  peVar18 = (element_type *)local_78._56_8_;
  if ((_Base_ptr)local_78._24_8_ != __position._M_node) {
    p_Var13 = (_Base_ptr)local_78._24_8_;
    do {
      uVar5 = local_168;
      iVar7 = (**(code **)(*local_188 + 0x48))();
      if (uVar5 < (ulong)(long)iVar7) {
        RunContext::runTest((Totals *)local_318,(RunContext *)(local_278 + 0x10),
                            *(TestCase **)(p_Var13 + 1));
        local_2d0._8_8_ = local_2d0._8_8_ + local_318._8_8_;
        local_2d0._16_8_ = (long)&(((string *)local_2d0._16_8_)->_M_dataplus)._M_p + local_308._0_8_
        ;
        local_2d0._24_8_ = local_2d0._24_8_ + local_308._8_8_;
        local_2d0._32_8_ = local_2d0._32_8_ + local_308._16_8_;
        local_2a8 = (pointer)((long)&(local_2a8->_M_dataplus)._M_p + local_308._24_8_);
        pbStack_2a0 = (pointer)((long)&(pbStack_2a0->_M_dataplus)._M_p + local_308._32_8_);
      }
      else {
        (**(code **)(*local_140 + 0x78))(local_140,*(undefined8 *)(p_Var13 + 1));
      }
      p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
      peVar16 = (element_type *)local_78._48_8_;
      peVar18 = (element_type *)local_78._56_8_;
    } while (p_Var13 != __position._M_node);
  }
  for (; peVar16 != peVar18; peVar16 = (element_type *)&(peVar16->m_data).benchmarkWarmupTime) {
    if (*(double *)&(peVar16->m_data).benchmarkSamples ==
        (peVar16->m_data).benchmarkConfidenceInterval) {
      (**(code **)(*local_140 + 0x18))(local_140,peVar16);
      local_2d0._0_4_ = 0xffffffff;
    }
  }
  lVar10 = *(long *)(CONCAT44(extraout_var_05,iVar6) + 0x20);
  for (lVar17 = *(long *)(CONCAT44(extraout_var_05,iVar6) + 0x18); lVar17 != lVar10;
      lVar17 = lVar17 + 0x20) {
    (**(code **)(*local_140 + 0x20))(local_140,lVar17);
  }
  (**(code **)(*(long *)local_278._0_8_ + 0x20))(local_318);
  RunContext::testGroupEnded
            ((RunContext *)(local_278 + 0x10),(string *)local_318,(Totals *)local_2d0,1,1);
  pbVar3 = local_290;
  if ((pointer)local_318._0_8_ != (pointer)local_308) {
    operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
  }
  iVar7 = (*(((__shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2> *)&pbVar3->_M_dataplus)->
             _M_ptr->super_IConfig).super_NonCopyable._vptr_NonCopyable[8])();
  iVar6 = 2;
  if (((byte)iVar7 & local_2d0._0_4_ == -1) == 0) {
    iVar7 = local_2d0._16_4_;
    if ((int)local_2d0._16_4_ <= (int)local_2d0._0_4_) {
      iVar7 = local_2d0._0_4_;
    }
    iVar6 = 0xff;
    if (iVar7 < 0xff) {
      iVar6 = iVar7;
    }
  }
  clara::std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
  ~vector((vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_> *)
          (local_78 + 0x30));
  clara::std::
  _Rb_tree<const_Catch::TestCase_*,_const_Catch::TestCase_*,_std::_Identity<const_Catch::TestCase_*>,_std::less<const_Catch::TestCase_*>,_std::allocator<const_Catch::TestCase_*>_>
  ::~_Rb_tree((_Rb_tree<const_Catch::TestCase_*,_const_Catch::TestCase_*,_std::_Identity<const_Catch::TestCase_*>,_std::less<const_Catch::TestCase_*>,_std::allocator<const_Catch::TestCase_*>_>
               *)local_78);
  RunContext::~RunContext((RunContext *)(local_278 + 0x10));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_);
  }
  return iVar6;
}

Assistant:

int Session::runInternal() {
        if( m_startupExceptions )
            return 1;

        if (m_configData.showHelp || m_configData.libIdentify) {
            return 0;
        }

        CATCH_TRY {
            config(); // Force config to be constructed

            seedRng( *m_config );

            if( m_configData.filenamesAsTags )
                applyFilenamesAsTags( *m_config );

            // Handle list request
            if( Option<std::size_t> listed = list( m_config ) )
                return (std::min) (MaxExitCode, static_cast<int>(*listed));

            TestGroup tests { m_config };
            auto const totals = tests.execute();

            if( m_config->warnAboutNoTests() && totals.error == -1 )
                return 2;

            // Note that on unices only the lower 8 bits are usually used, clamping
            // the return value to 255 prevents false negative when some multiple
            // of 256 tests has failed
            return (std::min) (MaxExitCode, (std::max) (totals.error, static_cast<int>(totals.assertions.failed)));
        }